

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

double ExtraCostCombined_C(uint32_t *X,uint32_t *Y,int length)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  for (uVar1 = 2; (long)uVar1 < (long)(length + -2); uVar1 = uVar1 + 1) {
    dVar2 = dVar2 + (double)(int)(((uint)(uVar1 >> 1) & 0x7fffffff) * (Y[uVar1 + 2] + X[uVar1 + 2]))
    ;
  }
  return dVar2;
}

Assistant:

static double ExtraCostCombined_C(const uint32_t* X, const uint32_t* Y,
                                  int length) {
  int i;
  double cost = 0.;
  for (i = 2; i < length - 2; ++i) {
    const int xy = X[i + 2] + Y[i + 2];
    cost += (i >> 1) * xy;
  }
  return cost;
}